

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O3

void duckdb::AggregateExecutor::UnaryUpdate<duckdb::SkewState,double,duckdb::SkewnessOperation>
               (Vector *input,AggregateInputData *aggr_input_data,data_ptr_t state,idx_t count)

{
  double dVar1;
  unsigned_long *puVar2;
  ulong uVar3;
  long lVar4;
  FunctionData *pFVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  AggregateUnaryInput input_data;
  undefined1 local_b8 [64];
  AggregateUnaryInput local_78;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  if (*input == (Vector)0x0) {
    lVar6 = *(long *)(input + 0x20);
    FlatVector::VerifyFlatVector(input);
    if (0x3f < count + 0x3f) {
      uVar11 = 0;
      uVar10 = 0;
      do {
        if (*(long *)(input + 0x28) == 0) {
          uVar12 = uVar10 + 0x40;
          if (count <= uVar10 + 0x40) {
            uVar12 = count;
          }
LAB_0049d911:
          lVar8 = uVar12 - uVar10;
          uVar7 = uVar10;
          if (uVar10 <= uVar12 && lVar8 != 0) {
            lVar4 = *(long *)state;
            dVar14 = *(double *)(state + 8);
            dVar15 = *(double *)(state + 0x10);
            dVar13 = *(double *)(state + 0x18);
            do {
              dVar1 = *(double *)(lVar6 + uVar10 * 8);
              dVar14 = dVar14 + dVar1;
              dVar15 = dVar15 + dVar1 * dVar1;
              dVar1 = pow(dVar1,3.0);
              dVar13 = dVar13 + dVar1;
              uVar10 = uVar10 + 1;
            } while (uVar12 != uVar10);
            *(long *)state = lVar8 + lVar4;
            *(double *)(state + 8) = dVar14;
            *(double *)(state + 0x10) = dVar15;
            *(double *)(state + 0x18) = dVar13;
            uVar7 = uVar12;
          }
        }
        else {
          uVar3 = *(ulong *)(*(long *)(input + 0x28) + uVar11 * 8);
          uVar12 = uVar10 + 0x40;
          if (count <= uVar10 + 0x40) {
            uVar12 = count;
          }
          if (uVar3 == 0xffffffffffffffff) goto LAB_0049d911;
          uVar7 = uVar12;
          if ((uVar3 != 0) && (uVar7 = uVar10, uVar10 < uVar12)) {
            uVar9 = 0;
            do {
              if ((uVar3 >> (uVar9 & 0x3f) & 1) != 0) {
                *(long *)state = *(long *)state + 1;
                dVar13 = *(double *)(lVar6 + uVar10 * 8 + uVar9 * 8);
                *(double *)(state + 8) = dVar13 + *(double *)(state + 8);
                *(double *)(state + 0x10) = dVar13 * dVar13 + *(double *)(state + 0x10);
                dVar13 = pow(dVar13,3.0);
                *(double *)(state + 0x18) = dVar13 + *(double *)(state + 0x18);
              }
              uVar9 = uVar9 + 1;
              uVar7 = uVar12;
            } while (uVar12 - uVar10 != uVar9);
          }
        }
        uVar10 = uVar7;
        uVar11 = uVar11 + 1;
      } while (uVar11 != count + 0x3f >> 6);
    }
  }
  else if (*input == (Vector)0x2) {
    if ((*(byte **)(input + 0x28) == (byte *)0x0) || ((**(byte **)(input + 0x28) & 1) != 0)) {
      local_78.input_mask = (ValidityMask *)(input + 0x28);
      local_78.input_idx = 0;
      local_78.input = aggr_input_data;
      SkewnessOperation::ConstantOperation<double,duckdb::SkewState,duckdb::SkewnessOperation>
                ((SkewState *)state,*(double **)(input + 0x20),&local_78,count);
    }
  }
  else {
    duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_78);
    duckdb::Vector::ToUnifiedFormat((ulong)input,(UnifiedVectorFormat *)count);
    if (local_78.input_idx == 0) {
      if (count != 0) {
        pFVar5 = ((local_78.input)->bind_data).ptr;
        lVar6 = *(long *)state;
        local_b8._0_16_ = *(undefined1 (*) [16])(state + 8);
        dVar13 = *(double *)(state + 0x18);
        uVar11 = 0;
        do {
          uVar10 = uVar11;
          if (pFVar5 != (FunctionData *)0x0) {
            uVar10 = (ulong)*(uint *)(pFVar5 + uVar11 * 4);
          }
          puVar2 = (&((local_78.input_mask)->super_TemplatedValidityMask<unsigned_long>).
                     validity_mask)[uVar10];
          dVar15 = (double)local_b8._0_8_ + (double)puVar2;
          dVar14 = (double)local_b8._8_8_ + (double)puVar2 * (double)puVar2;
          local_b8._8_4_ = SUB84(dVar14,0);
          local_b8._0_8_ = dVar15;
          local_b8._12_4_ = (int)((ulong)dVar14 >> 0x20);
          dVar14 = pow((double)puVar2,3.0);
          dVar13 = dVar13 + dVar14;
          uVar11 = uVar11 + 1;
        } while (count != uVar11);
        *(idx_t *)state = lVar6 + count;
        *(double *)(state + 8) = dVar15;
        *(undefined8 *)(state + 0x10) = local_b8._8_8_;
        *(double *)(state + 0x18) = dVar13;
      }
    }
    else if (count != 0) {
      pFVar5 = ((local_78.input)->bind_data).ptr;
      uVar11 = 0;
      do {
        uVar10 = uVar11;
        if (pFVar5 != (FunctionData *)0x0) {
          uVar10 = (ulong)*(uint *)(pFVar5 + uVar11 * 4);
        }
        if ((local_78.input_idx == 0) ||
           ((*(ulong *)(local_78.input_idx + (uVar10 >> 6) * 8) >> (uVar10 & 0x3f) & 1) != 0)) {
          *(long *)state = *(long *)state + 1;
          puVar2 = (&((local_78.input_mask)->super_TemplatedValidityMask<unsigned_long>).
                     validity_mask)[uVar10];
          *(double *)(state + 8) = (double)puVar2 + *(double *)(state + 8);
          *(double *)(state + 0x10) = (double)puVar2 * (double)puVar2 + *(double *)(state + 0x10);
          dVar13 = pow((double)puVar2,3.0);
          *(double *)(state + 0x18) = dVar13 + *(double *)(state + 0x18);
        }
        uVar11 = uVar11 + 1;
      } while (count != uVar11);
    }
    if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
    }
    if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58);
    }
  }
  return;
}

Assistant:

static void UnaryUpdate(Vector &input, AggregateInputData &aggr_input_data, data_ptr_t state, idx_t count) {
		switch (input.GetVectorType()) {
		case VectorType::CONSTANT_VECTOR: {
			if (OP::IgnoreNull() && ConstantVector::IsNull(input)) {
				return;
			}
			auto idata = ConstantVector::GetData<INPUT_TYPE>(input);
			AggregateUnaryInput input_data(aggr_input_data, ConstantVector::Validity(input));
			OP::template ConstantOperation<INPUT_TYPE, STATE_TYPE, OP>(*reinterpret_cast<STATE_TYPE *>(state), *idata,
			                                                           input_data, count);
			break;
		}
#ifndef DUCKDB_SMALLER_BINARY
		case VectorType::FLAT_VECTOR: {
			auto idata = FlatVector::GetData<INPUT_TYPE>(input);
			UnaryFlatUpdateLoop<STATE_TYPE, INPUT_TYPE, OP>(idata, aggr_input_data, (STATE_TYPE *)state, count,
			                                                FlatVector::Validity(input));
			break;
		}
#endif
		default: {
			UnifiedVectorFormat idata;
			input.ToUnifiedFormat(count, idata);
			UnaryUpdateLoop<STATE_TYPE, INPUT_TYPE, OP>(UnifiedVectorFormat::GetData<INPUT_TYPE>(idata),
			                                            aggr_input_data, (STATE_TYPE *)state, count, idata.validity,
			                                            *idata.sel);
			break;
		}
		}
	}